

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O0

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>::
add(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
    *this,vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
          *keys)

{
  int iVar1;
  size_type sVar2;
  Notifier *item;
  vector<double,_std::allocator<double>_> *in_RSI;
  ObserverBase *in_RDI;
  int id;
  int i;
  int max;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 1));
  iVar1 = (int)sVar2 + -1;
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    sVar2 = std::
            vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
            size((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                  *)in_RSI);
    if ((int)sVar2 <= iVar3) break;
    item = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
           ::ObserverBase::notifier(in_RDI);
    std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
    operator[]((vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                *)in_RSI,(long)iVar4);
    iVar3 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
            ::id((AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
                  *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),(Item *)item);
    if (iVar1 <= iVar3) {
      iVar1 = iVar3;
    }
    iVar3 = iVar4 + 1;
  }
  std::vector<double,_std::allocator<double>_>::resize(in_RSI,CONCAT44(iVar1,iVar4));
  return;
}

Assistant:

virtual void add(const std::vector<Key>& keys) {
    int max = container.size() - 1;
    for (int i = 0; i < int(keys.size()); ++i) {
      int id = Parent::notifier()->id(keys[i]);
      if (id >= max) {
        max = id;
      }
    }
    container.resize(max + 1);
  }